

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQInteger sqstd_rex_list(SQRex *exp)

{
  SQRex *exp_00;
  SQInteger SVar1;
  long in_RDI;
  SQInteger tright;
  SQInteger temp;
  SQInteger e;
  SQInteger ret;
  SQRex *pSVar2;
  
  pSVar2 = (SQRex *)0xffffffffffffffff;
  if (**(char **)(in_RDI + 0x10) == '^') {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    pSVar2 = (SQRex *)sqstd_rex_newnode((SQRex *)e,temp._4_4_);
  }
  exp_00 = (SQRex *)sqstd_rex_element(exp);
  if (pSVar2 != (SQRex *)0xffffffffffffffff) {
    *(SQRex **)(*(long *)(in_RDI + 0x28) + (long)pSVar2 * 0x20 + 0x18) = exp_00;
    exp_00 = pSVar2;
  }
  pSVar2 = exp_00;
  if (**(char **)(in_RDI + 0x10) == '|') {
    *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 1;
    pSVar2 = (SQRex *)sqstd_rex_newnode((SQRex *)e,temp._4_4_);
    *(SQRex **)(*(long *)(in_RDI + 0x28) + (long)pSVar2 * 0x20 + 8) = exp_00;
    SVar1 = sqstd_rex_list(exp_00);
    *(SQInteger *)(*(long *)(in_RDI + 0x28) + (long)pSVar2 * 0x20 + 0x10) = SVar1;
  }
  return (SQInteger)pSVar2;
}

Assistant:

static SQInteger sqstd_rex_list(SQRex *exp)
{
    SQInteger ret=-1,e;
    if(*exp->_p == SQREX_SYMBOL_BEGINNING_OF_STRING) {
        exp->_p++;
        ret = sqstd_rex_newnode(exp,OP_BOL);
    }
    e = sqstd_rex_element(exp);
    if(ret != -1) {
        exp->_nodes[ret].next = e;
    }
    else ret = e;

    if(*exp->_p == SQREX_SYMBOL_BRANCH) {
        SQInteger temp,tright;
        exp->_p++;
        temp = sqstd_rex_newnode(exp,OP_OR);
        exp->_nodes[temp].left = ret;
        tright = sqstd_rex_list(exp);
        exp->_nodes[temp].right = tright;
        ret = temp;
    }
    return ret;
}